

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O0

IEventListenerPtr __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory::create
          (TypedListenerFactory *this,IConfig *config)

{
  IEventListener *in_RDI;
  IEventListener *this_00;
  IConfig **in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  Detail::make_unique<Catch2ApprovalListener,Catch::IConfig_const*&>(in_stack_ffffffffffffffd8);
  Detail::unique_ptr<Catch::IEventListener>::unique_ptr<Catch2ApprovalListener,void>
            ((unique_ptr<Catch::IEventListener> *)this_00,
             (unique_ptr<Catch2ApprovalListener> *)in_RDI);
  Detail::unique_ptr<Catch2ApprovalListener>::~unique_ptr
            ((unique_ptr<Catch2ApprovalListener> *)this_00);
  return (IEventListenerPtr)in_RDI;
}

Assistant:

IEventListenerPtr create( IConfig const* config ) const override {
                return Detail::make_unique<T>( config );
            }